

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  cmOSXBundleGenerator *this_00;
  cmNinjaNormalTargetGenerator *this_local;
  
  (this->super_cmNinjaTargetGenerator)._vptr_cmNinjaTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00a50328;
  this_00 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
  if (this_00 != (cmOSXBundleGenerator *)0x0) {
    cmOSXBundleGenerator::~cmOSXBundleGenerator(this_00);
    operator_delete(this_00,0x40);
  }
  std::__cxx11::string::~string((string *)&this->TargetLinkLanguage);
  std::__cxx11::string::~string((string *)&this->TargetNamePDB);
  std::__cxx11::string::~string((string *)&this->TargetNameImport);
  std::__cxx11::string::~string((string *)&this->TargetNameReal);
  std::__cxx11::string::~string((string *)&this->TargetNameSO);
  std::__cxx11::string::~string((string *)&this->TargetNameOut);
  cmNinjaTargetGenerator::~cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator()
{
  delete this->OSXBundleGenerator;
}